

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O1

int run_ipc_send_recv_tcp(int inprocess)

{
  int iVar1;
  uv_loop_t *puVar2;
  sockaddr_in addr;
  sockaddr_in sStack_18;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_18);
  if (iVar1 == 0) {
    ctx.expected_type = UV_TCP;
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,&ctx.send.tcp);
    if (iVar1 != 0) goto LAB_0015f4eb;
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,&ctx.send2.tcp);
    if (iVar1 != 0) goto LAB_0015f4f0;
    iVar1 = uv_tcp_bind(&ctx.send.tcp,(sockaddr *)&sStack_18,0);
    if (iVar1 != 0) goto LAB_0015f4f5;
    iVar1 = uv_tcp_bind(&ctx.send2.tcp,(sockaddr *)&sStack_18,0);
    if (iVar1 == 0) {
      run_test(inprocess);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015f4ff;
    }
  }
  else {
    run_ipc_send_recv_tcp_cold_1();
LAB_0015f4eb:
    run_ipc_send_recv_tcp_cold_2();
LAB_0015f4f0:
    run_ipc_send_recv_tcp_cold_3();
LAB_0015f4f5:
    run_ipc_send_recv_tcp_cold_4();
  }
  run_ipc_send_recv_tcp_cold_5();
LAB_0015f4ff:
  run_ipc_send_recv_tcp_cold_6();
  run_ipc_send_recv_tcp(1);
  return 0;
}

Assistant:

static int run_ipc_send_recv_tcp(int inprocess) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ctx.expected_type = UV_TCP;

  r = uv_tcp_init(uv_default_loop(), &ctx.send.tcp);
  ASSERT(r == 0);

  r = uv_tcp_init(uv_default_loop(), &ctx.send2.tcp);
  ASSERT(r == 0);

  r = uv_tcp_bind(&ctx.send.tcp, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_tcp_bind(&ctx.send2.tcp, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = run_test(inprocess);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}